

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters.h
# Opt level: O3

void __thiscall sparse_parameters::~sparse_parameters(sparse_parameters *this)

{
  _Hash_node_base *p_Var1;
  
  if ((this->_delete == false) && (this->_seeded == false)) {
    for (p_Var1 = (this->_map)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
        p_Var1 = p_Var1->_M_nxt) {
      free(p_Var1[2]._M_nxt);
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)this);
    this->_delete = true;
  }
  if (this->default_data != (void *)0x0) {
    free(this->default_data);
  }
  free(this->default_value);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)this);
  return;
}

Assistant:

~sparse_parameters()
  {
    if (!_delete && !_seeded)  // don't free weight vector if it is shared with another instance
    {
      for (auto iter = _map.begin(); iter != _map.end(); ++iter) free(iter->second);
      _map.clear();
      _delete = true;
    }
    if (default_data != nullptr)
      free(default_data);
    free(default_value);
  }